

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall myEmployee::ArchiveOUT(myEmployee *this,ChArchiveOut *marchive)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__return_storage_ptr__;
  ChArchiveOut *pCVar1;
  char in_R9B;
  ChEnumMapper<myEnum> local_b0;
  ChNameValue<chrono::ChEnumMapper<myEnum>_> local_90;
  undefined1 local_78 [8];
  myEnum_mapper enum_map;
  ChNameValue<int> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  myEmployee *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  chrono::ChArchiveOut::VersionWrite<myEmployee>(marchive);
  pCVar1 = local_18;
  chrono::make_ChNameValue<int>(&local_30,"age",&this->age,'\0');
  chrono::ChArchiveOut::operator<<(pCVar1,&local_30);
  chrono::ChNameValue<int>::~ChNameValue(&local_30);
  pCVar1 = local_18;
  __return_storage_ptr__ =
       &enum_map.super_ChEnumMapper<myEnum>.enummap.
        super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount;
  chrono::make_ChNameValue<double>
            ((ChNameValue<double> *)__return_storage_ptr__,"wages",&this->wages,'\0');
  chrono::ChArchiveOut::operator<<(pCVar1,(ChNameValue<double> *)__return_storage_ptr__);
  chrono::ChNameValue<double>::~ChNameValue
            ((ChNameValue<double> *)
             &enum_map.super_ChEnumMapper<myEnum>.enummap.
              super___shared_ptr<std::vector<chrono::ChEnumNamePair<myEnum>,_std::allocator<chrono::ChEnumNamePair<myEnum>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  myEnum_mapper::myEnum_mapper((myEnum_mapper *)local_78);
  pCVar1 = local_18;
  myEnum_mapper::operator()(&local_b0,(myEnum_mapper *)local_78,&this->body);
  chrono::make_ChNameValue<chrono::ChEnumMapper<myEnum>>
            (&local_90,(chrono *)"enum_map(body)",(char *)&local_b0,(ChEnumMapper<myEnum> *)"body",
             (char *)0x0,in_R9B);
  chrono::ChArchiveOut::operator<<(pCVar1,&local_90);
  chrono::ChNameValue<chrono::ChEnumMapper<myEnum>_>::~ChNameValue(&local_90);
  chrono::ChEnumMapper<myEnum>::~ChEnumMapper(&local_b0);
  myEnum_mapper::~myEnum_mapper((myEnum_mapper *)local_78);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployee>();
        // stream out all member data
        marchive << CHNVP(age);
        marchive << CHNVP(wages);
        myEnum_mapper enum_map;
        marchive << CHNVP(enum_map(body), "body"); // note: CHNVP macro can override names used when streaming to ascii..
    }